

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

AggregateFunction *
duckdb::
GetGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
          (void)

{
  AggregateFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_79;
  LogicalType local_78;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  LogicalType local_48 [2];
  
  LogicalType::LogicalType(local_48,ANY);
  LogicalType::LogicalType(local_48 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_48;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,__l,&local_79);
  LogicalType::LogicalType(&local_78,ANY);
  AggregateFunction::AggregateFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_60,&local_78,
             AggregateFunction::StateSize<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
             ,AggregateFunction::
              StateInitialize<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>,(duckdb::AggregateDestructorType)1>
             ,VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>
              ::Update<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>,
             AggregateFunction::
             StateCombine<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
             ,AggregateFunction::
              StateVoidFinalize<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
             ,(aggregate_simple_update_t)0x0,
             VectorArgMinMaxBase<duckdb::LessThan,_true,_(duckdb::OrderType)3,_duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>_>
             ::Bind,AggregateFunction::
                    StateDestroy<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
             ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_78);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_48[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return in_RDI;
}

Assistant:

AggregateFunction GetGenericArgMinMaxFunction() {
	using STATE = ArgMinMaxState<string_t, string_t>;
	return AggregateFunction(
	    {LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY, AggregateFunction::StateSize<STATE>,
	    AggregateFunction::StateInitialize<STATE, OP, AggregateDestructorType::LEGACY>, OP::template Update<STATE>,
	    AggregateFunction::StateCombine<STATE, OP>, AggregateFunction::StateVoidFinalize<STATE, OP>, nullptr, OP::Bind,
	    AggregateFunction::StateDestroy<STATE, OP>);
}